

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpAcceptor.cpp
# Opt level: O2

void __thiscall
gmlc::networking::TcpAcceptor::handle_accept
          (TcpAcceptor *this,pointer *ptr,pointer *new_connection,error_code *error)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  int __fd;
  allocator<char> local_c9;
  error_code ec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  shared_ptr<gmlc::networking::TcpAcceptor> local_88;
  shared_ptr<gmlc::networking::TcpConnection> local_78;
  shared_ptr<gmlc::networking::TcpAcceptor> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((this->state)._M_i == CONNECTED) {
    if (error->_M_value == 0) {
      if ((this->acceptCall).super__Function_base._M_manager != (_Manager_type)0x0) {
        concurrency::TriggerVariable::reset(&this->accepting);
        local_68.super___shared_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (ptr->super___shared_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
        local_68.super___shared_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             (ptr->super___shared_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
        (ptr->super___shared_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>).
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        (ptr->super___shared_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
             = (element_type *)0x0;
        local_78.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (new_connection->
                 super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        local_78.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             (new_connection->
             super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
        (new_connection->
        super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
        ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        (new_connection->
        super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             (element_type *)0x0;
        std::
        function<void_(std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::shared_ptr<gmlc::networking::TcpConnection>)>
        ::operator()(&this->acceptCall,&local_68,&local_78);
        CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &local_78.
                    super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &local_68.
                    super___shared_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        if (((this->accepting).activated._M_base._M_i & 1U) != 0) {
          return;
        }
        concurrency::TriggerVariable::trigger(&this->accepting);
        return;
      }
      std::__shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2> *)&ec,
                 &(((new_connection->
                    super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)
                   ._M_ptr)->socket_).
                  super___shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>);
      __fd = 1;
      (**(code **)(*(long *)CONCAT44(ec._4_4_,ec._M_value) + 0x70))
                ((long *)CONCAT44(ec._4_4_,ec._M_value),1,0);
    }
    else {
      __fd = 0x7d;
      std::error_code::error_code<asio::error::basic_errors,void>(&ec,operation_aborted);
      if ((error->_M_cat == ec._M_cat) && (error->_M_value == ec._M_value)) goto LAB_0032af4d;
      if ((this->errorCall).super__Function_base._M_manager == (_Manager_type)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a8," error in accept::",&local_c9);
        (**(code **)(*(long *)error->_M_cat + 0x20))(&local_50,error->_M_cat,error->_M_value);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ec,
                       &local_a8,&local_50);
        logger(this,0,(string *)&ec);
        std::__cxx11::string::~string((string *)&ec);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_a8);
      }
      else {
        local_88.super___shared_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (ptr->super___shared_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
        local_88.super___shared_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             (ptr->super___shared_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
        (ptr->super___shared_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>).
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        (ptr->super___shared_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
             = (element_type *)0x0;
        std::
        function<bool_(std::shared_ptr<gmlc::networking::TcpAcceptor>,_const_std::error_code_&)>::
        operator()(&this->errorCall,&local_88,error);
        CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &local_88.
                    super___shared_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      std::__shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2> *)&ec,
                 &(((new_connection->
                    super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)
                   ._M_ptr)->socket_).
                  super___shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>);
      __fd = 1;
      (**(code **)(*(long *)CONCAT44(ec._4_4_,ec._M_value) + 0x70))
                ((long *)CONCAT44(ec._4_4_,ec._M_value),1,0);
    }
    pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ec;
  }
  else {
    ec._M_value = 0;
    ec._M_cat = (error_category *)std::_V2::system_category();
    std::__shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2> *)&local_a8,
               &(((new_connection->
                  super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr)->socket_).
                super___shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>);
    __fd = 1;
    (**(code **)(*(long *)local_a8._M_dataplus._M_p + 0x78))(local_a8._M_dataplus._M_p,1,0,&ec);
    pbVar1 = &local_a8;
  }
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pbVar1->_M_string_length);
LAB_0032af4d:
  TcpConnection::close
            ((new_connection->
             super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
             ,__fd);
  concurrency::TriggerVariable::reset(&this->accepting);
  return;
}

Assistant:

void TcpAcceptor::handle_accept(
    TcpAcceptor::pointer ptr,
    TcpConnection::pointer new_connection,
    const std::error_code& error)
{
    if (state.load() != AcceptingStates::CONNECTED) {
        std::error_code ec;
        new_connection->socket()->set_option_linger(true, 0, ec);
        new_connection->close();
        accepting.reset();
        return;
    }
    if (!error) {
        if (acceptCall) {
            accepting.reset();
            acceptCall(std::move(ptr), std::move(new_connection));
            if (!accepting.isActive()) {
                accepting.trigger();
            }
        } else {
            try {
                new_connection->socket()->set_option_linger(true, 0);
            }
            catch (...) {
            }
            new_connection->close();
            accepting.reset();
        }
    } else if (error != asio::error::operation_aborted) {
        if (errorCall) {
            errorCall(std::move(ptr), error);
        } else {
            logger(0, std::string(" error in accept::") + error.message());
        }
        try {
            new_connection->socket()->set_option_linger(true, 0);
        }
        catch (...) {
        }
        new_connection->close();
        accepting.reset();
    } else {
        new_connection->close();
        accepting.reset();
    }
}